

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::anon_unknown_8::LogFileObject::SetBasename(LogFileObject *this,char *basename)

{
  bool bVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  char *basename_local;
  LogFileObject *this_local;
  
  l._M_device = (mutex_type *)basename;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  this->base_filename_selected_ = true;
  bVar1 = std::operator!=(&this->base_filename_,(char *)l._M_device);
  if (bVar1) {
    bVar1 = std::operator!=(&this->file_,(nullptr_t)0x0);
    if (bVar1) {
      std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::operator=
                (&this->file_,(nullptr_t)0x0);
      this->rollover_attempt_ = 0x1f;
    }
    std::__cxx11::string::operator=((string *)&this->base_filename_,(char *)l._M_device);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void LogFileObject::SetBasename(const char* basename) {
  std::lock_guard<std::mutex> l{mutex_};
  base_filename_selected_ = true;
  if (base_filename_ != basename) {
    // Get rid of old log file since we are changing names
    if (file_ != nullptr) {
      file_ = nullptr;
      rollover_attempt_ = kRolloverAttemptFrequency - 1;
    }
    base_filename_ = basename;
  }
}